

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::DecimalRoundNegativePrecisionFunction<short,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  short sVar1;
  short sVar2;
  int iVar3;
  idx_t count;
  short *psVar4;
  short *psVar5;
  unsigned_long *puVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  data_ptr_t pdVar9;
  byte bVar10;
  byte bVar11;
  short sVar12;
  BoundFunctionExpression *pBVar13;
  pointer pFVar14;
  const_reference pvVar15;
  pointer pEVar16;
  reference vector;
  ulong uVar17;
  idx_t iVar18;
  short sVar19;
  idx_t i_2;
  idx_t entry_idx;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  idx_t i_1;
  idx_t iVar23;
  ulong uVar24;
  UnifiedVectorFormat local_78;
  
  pBVar13 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar14 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar13->bind_info);
  pvVar15 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&pBVar13->children,0);
  pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar15);
  bVar10 = DecimalType::GetScale(&pEVar16->return_type);
  pvVar15 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&pBVar13->children,0);
  pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar15);
  bVar11 = DecimalType::GetWidth(&pEVar16->return_type);
  iVar3 = *(int *)&pFVar14[1]._vptr_FunctionData;
  if ((int)((uint)bVar10 - (uint)bVar11) < iVar3) {
    sVar1 = *(short *)(NumericHelper::POWERS_OF_TEN + (long)(int)((uint)bVar10 - iVar3) * 8);
    sVar2 = *(short *)(NumericHelper::POWERS_OF_TEN + (long)iVar3 * -8);
    sVar12 = sVar1 / 2;
    vector = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    count = input->count;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar9 = result->data;
      pdVar7 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (iVar23 = 0; count != iVar23; iVar23 = iVar23 + 1) {
          sVar19 = sVar12;
          if (*(short *)(pdVar7 + iVar23 * 2) < 0) {
            sVar19 = -sVar12;
          }
          *(short *)(pdVar9 + iVar23 * 2) =
               ((short)(sVar19 + *(short *)(pdVar7 + iVar23 * 2)) / sVar1) * sVar2;
        }
      }
      else {
        TemplatedValidityMask<unsigned_long>::Initialize
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>);
        puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar21 = 0;
        for (uVar20 = 0; uVar20 != count + 0x3f >> 6; uVar20 = uVar20 + 1) {
          if (puVar6 == (unsigned_long *)0x0) {
            uVar22 = uVar21 + 0x40;
            if (count <= uVar21 + 0x40) {
              uVar22 = count;
            }
LAB_01d1e818:
            for (; uVar17 = uVar21, uVar21 < uVar22; uVar21 = uVar21 + 1) {
              sVar19 = sVar12;
              if (*(short *)(pdVar7 + uVar21 * 2) < 0) {
                sVar19 = -sVar12;
              }
              *(short *)(pdVar9 + uVar21 * 2) =
                   ((short)(sVar19 + *(short *)(pdVar7 + uVar21 * 2)) / sVar1) * sVar2;
            }
          }
          else {
            uVar8 = puVar6[uVar20];
            uVar22 = uVar21 + 0x40;
            if (count <= uVar21 + 0x40) {
              uVar22 = count;
            }
            if (uVar8 == 0xffffffffffffffff) goto LAB_01d1e818;
            uVar17 = uVar22;
            if (uVar8 != 0) {
              for (uVar24 = 0; uVar17 = uVar21 + uVar24, uVar21 + uVar24 < uVar22;
                  uVar24 = uVar24 + 1) {
                if ((uVar8 >> (uVar24 & 0x3f) & 1) != 0) {
                  sVar19 = sVar12;
                  if (*(short *)(pdVar7 + uVar24 * 2 + uVar21 * 2) < 0) {
                    sVar19 = -sVar12;
                  }
                  *(short *)(pdVar9 + uVar24 * 2 + uVar21 * 2) =
                       ((short)(sVar19 + *(short *)(pdVar7 + uVar24 * 2 + uVar21 * 2)) / sVar1) *
                       sVar2;
                }
              }
            }
          }
          uVar21 = uVar17;
        }
      }
    }
    else if (vector->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      psVar4 = (short *)result->data;
      psVar5 = (short *)vector->data;
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      sVar19 = -sVar12;
      if (-1 < *psVar5) {
        sVar19 = sVar12;
      }
      *psVar4 = sVar2 * ((short)(sVar19 + *psVar5) / sVar1);
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,count,&local_78);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar9 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (iVar23 = 0; count != iVar23; iVar23 = iVar23 + 1) {
          iVar18 = iVar23;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar18 = (idx_t)(local_78.sel)->sel_vector[iVar23];
          }
          sVar19 = sVar12;
          if (*(short *)(local_78.data + iVar18 * 2) < 0) {
            sVar19 = -sVar12;
          }
          *(short *)(pdVar9 + iVar23 * 2) =
               ((short)(sVar19 + *(short *)(local_78.data + iVar18 * 2)) / sVar1) * sVar2;
        }
      }
      else {
        for (iVar23 = 0; count != iVar23; iVar23 = iVar23 + 1) {
          iVar18 = iVar23;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            iVar18 = (idx_t)(local_78.sel)->sel_vector[iVar23];
          }
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar18 >> 6] >> (iVar18 & 0x3f) & 1) == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar23);
          }
          else {
            sVar19 = sVar12;
            if (*(short *)(local_78.data + iVar18 * 2) < 0) {
              sVar19 = -sVar12;
            }
            *(short *)(pdVar9 + iVar23 * 2) =
                 ((short)(sVar19 + *(short *)(local_78.data + iVar18 * 2)) / sVar1) * sVar2;
          }
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
    }
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    Value::INTEGER((Value *)&local_78,0);
    Vector::SetValue(result,0,(Value *)&local_78);
    Value::~Value((Value *)&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}